

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endec_filter.hxx
# Opt level: O3

bool __thiscall
cryptox::basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>::
filter(basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>
       *this,char **src_begin,char *src_end,char **dest_begin,char *dest_end,bool must_flush)

{
  deque<char,_std::allocator<char>_> *d_first;
  char *first;
  char *pcVar1;
  _Map_pointer ppcVar2;
  char *pcVar3;
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
  *this_00;
  _Map_pointer ppcVar4;
  ulong uVar5;
  _Elt_pointer pcVar6;
  _Elt_pointer pcVar7;
  unsigned_long __n2;
  char *pcVar8;
  bool bVar9;
  _Deque_iterator<char,_char_&,_char_*> local_90;
  _Deque_iterator<char,_char_&,_char_*> local_70;
  iterator local_50;
  
  first = *src_begin;
  pcVar1 = *dest_begin;
  d_first = &this->_output;
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
  ::update<char_const*,std::back_insert_iterator<std::deque<char,std::allocator<char>>>>
            ((evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
              *)(this->_endec)._M_ptr,first,src_end,
             (back_insert_iterator<std::deque<char,_std::allocator<char>_>_>)d_first);
  this->_total_input = (size_t)(src_end + (this->_total_input - (long)*src_begin));
  *src_begin = src_end;
  ppcVar2 = (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  ppcVar4 = (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  pcVar7 = (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  pcVar6 = (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pcVar3 = (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
  pcVar8 = pcVar3 + (long)(pcVar7 + ((((((ulong)((long)ppcVar2 - (long)ppcVar4) >> 3) - 1) +
                                      (ulong)(ppcVar2 == (_Map_pointer)0x0)) * 0x200 -
                                     (long)(this->_output).
                                           super__Deque_base<char,_std::allocator<char>_>._M_impl.
                                           super__Deque_impl_data._M_finish._M_first) - (long)pcVar6
                                    ));
  if (dest_end + -(long)pcVar1 <=
      pcVar3 + (long)(pcVar7 + ((((((ulong)((long)ppcVar2 - (long)ppcVar4) >> 3) - 1) +
                                 (ulong)(ppcVar2 == (_Map_pointer)0x0)) * 0x200 -
                                (long)(this->_output).super__Deque_base<char,_std::allocator<char>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_first) -
                               (long)pcVar6))) {
    pcVar8 = dest_end + -(long)pcVar1;
  }
  if (pcVar7 == pcVar6) goto LAB_0026bca5;
  local_70._M_first =
       (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data
       ._M_start._M_first;
  if (pcVar8 != (char *)0x0) {
    pcVar7 = pcVar6 + ((long)pcVar8 - (long)local_70._M_first);
    if ((long)pcVar7 < 0) {
      uVar5 = (long)pcVar7 >> 9;
LAB_0026bbca:
      local_90._M_node = ppcVar4 + uVar5;
      local_90._M_first = *local_90._M_node;
      local_90._M_last = local_90._M_first + 0x200;
      local_90._M_cur = local_90._M_first + (long)(pcVar7 + uVar5 * -0x200);
    }
    else {
      if ((_Elt_pointer)0x1ff < pcVar7) {
        uVar5 = (ulong)pcVar7 >> 9;
        goto LAB_0026bbca;
      }
      local_90._M_cur = pcVar6 + (long)pcVar8;
      local_90._M_first = local_70._M_first;
      local_90._M_node = ppcVar4;
      local_90._M_last = pcVar3;
    }
    local_70._M_cur = pcVar6;
    local_70._M_last = pcVar3;
    local_70._M_node = ppcVar4;
    std::__copy_move_dit<false,char,char&,char*,char*>(&local_70,&local_90,*dest_begin);
    pcVar6 = (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    local_70._M_first =
         (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
         super__Deque_impl_data._M_start._M_first;
    ppcVar4 = (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
  }
  pcVar7 = pcVar6 + ((long)pcVar8 - (long)local_70._M_first);
  if ((long)pcVar7 < 0) {
    uVar5 = (long)pcVar7 >> 9;
LAB_0026bc48:
    local_90._M_node = ppcVar4 + uVar5;
    local_90._M_cur = *local_90._M_node + (long)(pcVar7 + uVar5 * -0x200);
  }
  else {
    if ((_Elt_pointer)0x1ff < pcVar7) {
      uVar5 = (ulong)pcVar7 >> 9;
      goto LAB_0026bc48;
    }
    local_90._M_cur = pcVar6 + (long)pcVar8;
    local_90._M_node = ppcVar4;
  }
  local_70._M_first = *ppcVar4;
  local_70._M_last = local_70._M_first + 0x200;
  local_90._M_first = *local_90._M_node;
  local_90._M_last = local_90._M_first + 0x200;
  local_70._M_cur = pcVar6;
  local_70._M_node = ppcVar4;
  std::deque<char,_std::allocator<char>_>::_M_erase(&local_50,d_first,&local_70,&local_90);
  *dest_begin = *dest_begin + (long)pcVar8;
  this->_total_output = (size_t)(pcVar8 + this->_total_output);
LAB_0026bca5:
  if (must_flush) {
    if ((this->_finalized == false) &&
       (this_00 = (evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
                   *)(this->_endec)._M_ptr, *(long *)(this_00 + 0x10) != 0)) {
      evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
      ::finalize<std::back_insert_iterator<std::deque<char,std::allocator<char>>>>
                (this_00,(back_insert_iterator<std::deque<char,_std::allocator<char>_>_>)d_first);
    }
    this->_finalized = true;
    bVar9 = (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  }
  else {
    bVar9 = first == src_end;
  }
  return !bVar9;
}

Assistant:

bool filter(const char*& src_begin, const char* src_end, char*& dest_begin, char* dest_end, bool must_flush) {
			const size_t  input_size = std::distance( src_begin,  src_end);
			const size_t output_size = std::distance(dest_begin, dest_end);

			// Process Input...
			_endec->update(src_begin, src_end, std::back_inserter(_output));
			_total_input += std::distance(src_begin, src_end);
			src_begin = src_end;

			// Process Output...
			const size_t output_capacity = std::min BOOST_PREVENT_MACRO_SUBSTITUTION(
				output_size,
				_output.size()
			);

			if (!_output.empty()) {
				std::copy_n(_output.begin(), output_capacity, dest_begin);
				_output.erase(_output.begin(), _output.begin() + output_capacity);
				dest_begin += output_capacity;
				_total_output += output_capacity;
			}

			if (must_flush) {
				finalize();
				return !_output.empty();
			}

			return input_size != 0;
		}